

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint ON_MeshNgon::FindPlanarNgons
               (ON_3dPointListRef *vertex_list,ON_MeshFaceList *face_list,uint **vertex_face_map,
               double planar_tolerance,uint minimum_ngon_vertex_count,uint minimum_ngon_face_count,
               bool bAllowHoles,ON_MeshNgonAllocator *NgonAllocator,
               ON_SimpleArray<unsigned_int> *NgonMap,ON_SimpleArray<ON_MeshNgon_*> *Ngons)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  float *pfVar5;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint *puVar10;
  long *plVar11;
  NgonNeighbors *pNVar12;
  undefined8 extraout_RAX;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint *__s;
  uint uVar16;
  double *pdVar17;
  long lVar18;
  undefined7 in_register_00000089;
  uint *puVar19;
  double dVar20;
  _func_int **pp_Var21;
  ulong uVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  _func_int **pp_Var26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  ON_SimpleArray<unsigned_int> ngon_fi;
  uint nbr_face_index;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<unsigned_int> ngon_vi;
  ON_MeshNgon *ngon;
  ON_3dVector A;
  uint Fvi [4];
  ON_3dVector B;
  double buffer [4] [3];
  ON_MeshVertexFaceMap ws_vfmap;
  uint local_334;
  uint local_314;
  ON_SimpleArray<unsigned_int> local_310;
  ulong local_2f8;
  double local_2f0;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  ON_MeshFaceList *local_2c8;
  ON_SimpleArray<NgonNeighbors> local_2c0;
  ON_SimpleArray<unsigned_int> local_2a8;
  ON_MeshNgon *local_290;
  double local_288;
  undefined8 uStack_280;
  uint *local_278;
  undefined8 uStack_270;
  double local_268;
  undefined8 uStack_260;
  _func_int **local_258;
  undefined8 uStack_250;
  uint **local_248;
  double local_240;
  ulong local_238;
  double local_230;
  double local_228;
  undefined4 local_220;
  uint local_21c;
  undefined1 local_218 [16];
  double local_208;
  double dStack_200;
  uint local_1f8 [4];
  undefined1 local_1e8 [16];
  ON_3dVector local_1d8;
  ulong local_1c0;
  ON_3dVector local_1b8;
  undefined1 local_198 [16];
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  uint *local_168;
  undefined8 uStack_160;
  undefined **local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  ON_Plane local_108;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  ON_MeshVertexFaceMap local_48;
  
  local_220 = (undefined4)CONCAT71(in_register_00000089,bAllowHoles);
  local_2e0 = Ngons->m_count;
  uVar15 = vertex_list->m_point_count;
  uVar16 = face_list->m_face_count;
  dVar25 = (double)(ulong)uVar16;
  bVar2 = face_list->m_bQuadFaces;
  local_2e4 = minimum_ngon_vertex_count;
  local_21c = minimum_ngon_face_count;
  ON_MeshVertexFaceMap::ON_MeshVertexFaceMap(&local_48);
  local_2a8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
  local_2a8.m_a = (uint *)0x0;
  local_2a8.m_count = 0;
  local_2a8.m_capacity = 0;
  local_150 = &PTR__ON_SimpleArray_0080d8d0;
  local_310._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
  local_310.m_a = (uint *)0x0;
  local_310.m_count = 0;
  local_310.m_capacity = 0;
  local_2c0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814f70;
  local_2c0.m_a = (NgonNeighbors *)0x0;
  local_2c0.m_count = 0;
  local_2c0.m_capacity = 0;
  ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)local_128);
  if ((uVar16 == 0 || uVar16 != NgonMap->m_count) && (-1 < NgonMap->m_capacity)) {
    NgonMap->m_count = 0;
  }
  if ((uVar15 != 0 && uVar16 != 0) &&
     ((vertex_face_map != (uint **)0x0 ||
      (bVar7 = ON_MeshVertexFaceMap::SetFromFaceList(&local_48,uVar15,face_list,false),
      vertex_face_map = local_48.m_vertex_face_map,
      local_48.m_vertex_face_map != (uint **)0x0 && bVar7)))) {
    if ((uint)local_2a8.m_capacity < 0x80) {
      ON_SimpleArray<unsigned_int>::SetCapacity(&local_2a8,0x80);
    }
    if ((uint)local_310.m_capacity < 0x80) {
      ON_SimpleArray<unsigned_int>::SetCapacity(&local_310,0x80);
    }
    if ((uint)local_2c0.m_capacity < 0x80) {
      ON_SimpleArray<NgonNeighbors>::SetCapacity(&local_2c0,0x80);
    }
    if (uVar16 == NgonMap->m_count) {
      __s = NgonMap->m_a;
    }
    else {
      iVar8 = NgonMap->m_capacity;
      if ((ulong)(long)iVar8 < (ulong)dVar25) {
        ON_SimpleArray<unsigned_int>::SetCapacity(NgonMap,(size_t)dVar25);
        iVar8 = NgonMap->m_capacity;
      }
      if ((-1 < (int)uVar16) && ((int)uVar16 <= iVar8)) {
        NgonMap->m_count = uVar16;
      }
      __s = NgonMap->m_a;
      memset(__s,0xff,(long)dVar25 * 4);
    }
    local_148 = (ulong)bVar2;
    local_130 = (ulong)bVar2 + 3;
    dVar20 = 0.0;
    local_2f8 = 0;
    local_334 = local_2e0;
    local_1c0 = 0;
    do {
      if (__s[(long)dVar20] == 0xffffffff) {
        if ((ulong)dVar20 < (ulong)face_list->m_face_count) {
          puVar19 = face_list->m_faces;
          uVar14 = (ulong)(face_list->m_face_stride * SUB84(dVar20,0));
          local_1f8[0] = puVar19[uVar14];
          local_1f8[1] = puVar19[uVar14 + 1];
          local_1f8[2] = puVar19[uVar14 + 2];
          local_1f8[3] = local_1f8[2];
          if (face_list->m_bQuadFaces == true) {
            local_1f8[3] = puVar19[uVar14 + 3];
          }
          if ((local_1f8[1] != local_1f8[2] && local_1f8[0] != local_1f8[1]) &&
             (local_1f8[0] != *(uint *)(local_1e8 + local_148 * 4 + -8))) {
            uVar15 = vertex_list->m_point_count;
            pdVar4 = vertex_list->m_dP;
            uVar16 = vertex_list->m_point_stride;
            pfVar5 = vertex_list->m_fP;
            pdVar17 = &local_108.origin.z;
            lVar18 = 0;
            do {
              if (uVar15 <= local_1f8[lVar18]) goto LAB_00529216;
              uVar14 = (ulong)(local_1f8[lVar18] * uVar16);
              if (pdVar4 == (double *)0x0) {
                uVar1 = *(undefined8 *)(pfVar5 + uVar14);
                dVar24 = (double)(float)uVar1;
                dVar27 = (double)(float)((ulong)uVar1 >> 0x20);
                dVar28 = (double)pfVar5[uVar14 + 2];
              }
              else {
                dVar24 = pdVar4[uVar14];
                dVar27 = (pdVar4 + uVar14)[1];
                dVar28 = pdVar4[uVar14 + 2];
              }
              ((ON_3dPoint *)(pdVar17 + -2))->x = dVar24;
              pdVar17[-1] = dVar27;
              *pdVar17 = dVar28;
              dVar28 = local_108.yaxis.x;
              lVar18 = lVar18 + 1;
              pdVar17 = pdVar17 + 3;
            } while (local_130 != lVar18);
            if (bVar2 == false) {
              local_108.zaxis.z = local_108.yaxis.z;
              local_108.zaxis.x = local_108.yaxis.x;
              local_108.zaxis.y = local_108.yaxis.y;
            }
            local_258 = (_func_int **)local_108.origin.x;
            uStack_250 = 0;
            local_2f0 = local_108.yaxis.y;
            local_168 = (uint *)local_108.origin.y;
            uStack_160 = 0;
            local_178 = local_108.yaxis.z;
            uStack_170 = 0;
            local_288 = local_108.origin.z;
            uStack_280 = 0;
            ON_3dVector::ON_3dVector
                      ((ON_3dVector *)local_218,local_108.yaxis.x - local_108.origin.x,
                       local_108.yaxis.y - local_108.origin.y,local_108.yaxis.z - local_108.origin.z
                      );
            local_228 = local_108.zaxis.x;
            local_268 = local_108.xaxis.x;
            uStack_260 = 0;
            local_230 = local_108.zaxis.y;
            local_278 = (uint *)local_108.xaxis.y;
            uStack_270 = 0;
            local_188 = local_108.zaxis.z;
            uStack_180 = 0;
            local_2d8 = local_108.xaxis.z;
            uStack_2d0 = 0;
            ON_3dVector::ON_3dVector
                      (&local_1d8,local_108.zaxis.x - local_108.xaxis.x,
                       local_108.zaxis.y - local_108.xaxis.y,local_108.zaxis.z - local_108.xaxis.z);
            ON_3dVector::ON_3dVector
                      (&local_1b8,(double)local_218._8_8_ * local_1d8.z - local_208 * local_1d8.y,
                       local_208 * local_1d8.x - local_1d8.z * (double)local_218._0_8_,
                       (double)local_218._0_8_ * local_1d8.y - (double)local_218._8_8_ * local_1d8.x
                      );
            dVar24 = ON_3dVector::Length(&local_1b8);
            if (0.0 < dVar24) {
              auVar6._8_8_ = local_1b8.y;
              auVar6._0_8_ = local_1b8.x;
              auVar29._8_8_ = dVar24;
              auVar29._0_8_ = dVar24;
              auVar29 = divpd(auVar6,auVar29);
              dVar24 = local_1b8.z / dVar24;
              dVar30 = auVar29._8_8_;
              dVar27 = auVar29._0_8_;
              dVar31 = local_288 * dVar24 + (double)local_258 * dVar27 + (double)local_168 * dVar30;
              if (((ABS((local_2d8 * dVar24 + local_268 * dVar27 + (double)local_278 * dVar30) -
                        dVar31) <= planar_tolerance) &&
                  (ABS((local_178 * dVar24 + dVar28 * dVar27 + local_2f0 * dVar30) - dVar31) <=
                   planar_tolerance)) &&
                 (ABS((local_188 * dVar24 + local_228 * dVar27 + local_230 * dVar30) - dVar31) <=
                  planar_tolerance)) {
                dStack_200 = -dVar31;
                local_290 = (ON_MeshNgon *)0x0;
                if (-1 < (long)local_310._16_8_) {
                  local_310._16_8_ = local_310._16_8_ & 0xffffffff00000000;
                }
                uVar15 = vertex_list->m_point_count;
                local_314 = SUB84(dVar20,0);
                local_218 = auVar29;
                local_208 = dVar24;
                local_128 = auVar29;
                local_118 = dVar24;
                dStack_110 = dStack_200;
                ON_SimpleArray<unsigned_int>::Append(&local_310,&local_314);
                if (-1 < (long)local_2c0._16_8_) {
                  local_2c0._16_8_ = local_2c0._16_8_ & 0xffffffff00000000;
                }
                ON_SimpleArray<NgonNeighbors>::AppendNew(&local_2c0);
                __s[local_314] = local_334;
                if (local_310.m_count != 0) {
                  uVar14 = 0;
                  uVar16 = 0;
                  local_2c8 = face_list;
                  local_248 = vertex_face_map;
                  local_240 = dVar25;
                  local_230 = dVar20;
LAB_00528b2e:
                  local_188 = (double)CONCAT44(local_188._4_4_,local_310.m_count);
LAB_00528b37:
                  local_268 = (double)(ulong)uVar16;
                  uVar16 = local_310.m_a[(long)local_268];
                  local_168 = (uint *)CONCAT44(local_168._4_4_,uVar16);
                  if (uVar16 < face_list->m_face_count) {
                    puVar19 = face_list->m_faces;
                    uVar13 = (ulong)(face_list->m_face_stride * uVar16);
                    local_198._0_8_ = *(undefined8 *)(puVar19 + uVar13);
                    local_198._12_4_ = puVar19[uVar13 + 2];
                    local_198._8_4_ = local_198._12_4_;
                    if (face_list->m_bQuadFaces == true) {
                      local_198._12_4_ = puVar19[uVar13 + 3];
                    }
                    uVar13 = local_198._0_8_ & 0xffffffff;
                    if (uVar15 < (uint)local_198._0_8_) {
                      puVar19 = (uint *)0x0;
                      goto LAB_00528bd4;
                    }
                  }
                  else {
                    local_198 = (undefined1  [16])0x0;
                    uVar13 = 0;
                  }
                  puVar10 = vertex_face_map[uVar13];
                  if (puVar10 == (uint *)0x0) {
                    puVar19 = (uint *)0x0;
                  }
                  else {
                    puVar19 = (uint *)0x0;
                    if (1 < *puVar10) {
                      puVar19 = puVar10;
                    }
                  }
LAB_00528bd4:
                  local_228 = (double)((long)local_268 * 8 + 4);
                  pp_Var26 = (_func_int **)0x0;
LAB_00528bef:
                  pp_Var21 = (_func_int **)((long)pp_Var26 + 1);
                  uVar16 = *(uint *)(local_198 + (ulong)((uint)pp_Var21 & 3) * 4);
                  puVar10 = puVar19;
                  local_258 = pp_Var26;
                  if ((uint)uVar13 != uVar16) {
                    uVar9 = (int)uVar14 + 1;
                    if (uVar16 <= uVar15) {
                      local_288 = (double)CONCAT44(local_288._4_4_,uVar9);
                      puVar10 = vertex_face_map[uVar16];
                      if ((puVar10 != (uint *)0x0) && (1 < *puVar10)) {
                        if (puVar19 == (uint *)0x0) {
                          uVar14 = (ulong)uVar9;
                        }
                        else {
                          local_278 = puVar10;
                          if (local_2c0.m_a[(long)local_268].m_NFS[(long)pp_Var26] == 0) {
                            local_138 = (long)local_268 * 0x20;
                            if (*puVar19 != 0) {
                              local_140 = (long)local_228 + (long)pp_Var26;
                              uVar22 = 1;
                              local_2f0 = (double)CONCAT44(local_2f0._4_4_,(uint)uVar13);
                              local_238 = uVar14;
LAB_00528cba:
                              local_2dc = puVar19[uVar22];
                              if ((((uint)local_168 != local_2dc) && (local_314 < local_2dc)) &&
                                 (__s[local_2dc] == 0xffffffff || __s[local_2dc] == local_334)) {
                                if (local_2dc < local_2c8->m_face_count) {
                                  puVar10 = local_2c8->m_faces;
                                  uVar14 = (ulong)(local_2dc * local_2c8->m_face_stride);
                                  uVar9 = puVar10[uVar14];
                                  dVar25 = (double)(ulong)puVar10[uVar14 + 1];
                                  local_1e8._4_4_ = puVar10[uVar14 + 1];
                                  local_1e8._0_4_ = uVar9;
                                  uVar3 = puVar10[uVar14 + 2];
                                  local_1e8._8_4_ = uVar3;
                                  local_2d8 = (double)CONCAT44(local_2d8._4_4_,uVar3);
                                  if (local_2c8->m_bQuadFaces == true) {
                                    uVar3 = puVar10[uVar14 + 3];
                                  }
                                  local_1e8._12_4_ = uVar3;
                                }
                                else {
                                  local_1e8 = (undefined1  [16])0x0;
                                  uVar3 = 0;
                                  local_2d8 = (double)((ulong)local_2d8._4_4_ << 0x20);
                                  dVar25 = 0.0;
                                  uVar9 = 0;
                                }
                                lVar23 = 4;
                                lVar18 = 0;
                                do {
                                  if ((uVar16 == local_1f8[lVar23]) &&
                                     ((int)uVar13 ==
                                      *(int *)(local_1e8 + (ulong)((int)lVar23 - 3U & 3) * 4))) {
                                    local_108.origin.z = local_208;
                                    local_108.xaxis.x = dStack_200;
                                    local_108.origin.x = (double)local_218._0_8_;
                                    local_108.origin.y = (double)local_218._8_8_;
                                    local_1d8.z = -1.23432101234321e+308;
                                    local_1d8.x = -1.23432101234321e+308;
                                    local_1d8.y = -1.23432101234321e+308;
                                    if (uVar9 < vertex_list->m_point_count) {
                                      pdVar17 = vertex_list->m_dP;
                                      if (pdVar17 == (double *)0x0) {
                                        uVar14 = (ulong)(uVar9 * vertex_list->m_point_stride);
                                        uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar14);
                                        local_1d8.x = (double)(float)uVar1;
                                        local_1d8.y = (double)(float)((ulong)uVar1 >> 0x20);
                                        local_1d8.z = (double)vertex_list->m_fP[uVar14 + 2];
                                      }
                                      else {
                                        uVar14 = (ulong)(uVar9 * vertex_list->m_point_stride);
                                        local_1d8.x = pdVar17[uVar14];
                                        local_1d8.y = (pdVar17 + uVar14)[1];
                                        local_1d8.z = pdVar17[uVar14 + 2];
                                      }
                                    }
                                    P.y = local_1d8.y;
                                    P.x = local_1d8.x;
                                    P.z = local_1d8.z;
                                    local_178 = dVar25;
                                    dVar25 = ON_PlaneEquation::ValueAt
                                                       ((ON_PlaneEquation *)&local_108,P);
                                    if (ABS(dVar25) <= planar_tolerance) {
                                      local_1b8.z = -1.23432101234321e+308;
                                      local_1b8.x = -1.23432101234321e+308;
                                      local_1b8.y = -1.23432101234321e+308;
                                      uVar9 = SUB84(local_178,0);
                                      if (uVar9 < vertex_list->m_point_count) {
                                        pdVar17 = vertex_list->m_dP;
                                        if (pdVar17 == (double *)0x0) {
                                          uVar14 = (ulong)(uVar9 * vertex_list->m_point_stride);
                                          uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar14);
                                          local_1b8.x = (double)(float)uVar1;
                                          local_1b8.y = (double)(float)((ulong)uVar1 >> 0x20);
                                          local_1b8.z = (double)vertex_list->m_fP[uVar14 + 2];
                                        }
                                        else {
                                          uVar14 = (ulong)(uVar9 * vertex_list->m_point_stride);
                                          local_1b8.x = pdVar17[uVar14];
                                          local_1b8.y = (pdVar17 + uVar14)[1];
                                          local_1b8.z = pdVar17[uVar14 + 2];
                                        }
                                      }
                                      P_00.y = local_1b8.y;
                                      P_00.x = local_1b8.x;
                                      P_00.z = local_1b8.z;
                                      dVar25 = ON_PlaneEquation::ValueAt
                                                         ((ON_PlaneEquation *)&local_108,P_00);
                                      if (ABS(dVar25) <= planar_tolerance) {
                                        local_58 = -1.23432101234321e+308;
                                        local_68 = -1.23432101234321e+308;
                                        dStack_60 = -1.23432101234321e+308;
                                        if ((uint)local_2d8 < vertex_list->m_point_count) {
                                          pdVar17 = vertex_list->m_dP;
                                          if (pdVar17 == (double *)0x0) {
                                            uVar14 = (ulong)(vertex_list->m_point_stride *
                                                            (uint)local_2d8);
                                            uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar14);
                                            local_68 = (double)(float)uVar1;
                                            dStack_60 = (double)(float)((ulong)uVar1 >> 0x20);
                                            local_58 = (double)vertex_list->m_fP[uVar14 + 2];
                                          }
                                          else {
                                            uVar14 = (ulong)(vertex_list->m_point_stride *
                                                            (uint)local_2d8);
                                            local_68 = pdVar17[uVar14];
                                            dStack_60 = (pdVar17 + uVar14)[1];
                                            local_58 = pdVar17[uVar14 + 2];
                                          }
                                        }
                                        P_01.y = dStack_60;
                                        P_01.x = local_68;
                                        P_01.z = local_58;
                                        dVar25 = ON_PlaneEquation::ValueAt
                                                           ((ON_PlaneEquation *)&local_108,P_01);
                                        if (ABS(dVar25) <= planar_tolerance) {
                                          if (uVar3 != (uint)local_2d8) {
                                            local_78 = -1.23432101234321e+308;
                                            local_88 = -1.23432101234321e+308;
                                            dStack_80 = -1.23432101234321e+308;
                                            if (uVar3 < vertex_list->m_point_count) {
                                              pdVar17 = vertex_list->m_dP;
                                              if (pdVar17 == (double *)0x0) {
                                                uVar14 = (ulong)(uVar3 * vertex_list->m_point_stride
                                                                );
                                                uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar14);
                                                local_88 = (double)(float)uVar1;
                                                dStack_80 = (double)(float)((ulong)uVar1 >> 0x20);
                                                local_78 = (double)vertex_list->m_fP[uVar14 + 2];
                                              }
                                              else {
                                                uVar14 = (ulong)(uVar3 * vertex_list->m_point_stride
                                                                );
                                                local_88 = pdVar17[uVar14];
                                                dStack_80 = (pdVar17 + uVar14)[1];
                                                local_78 = pdVar17[uVar14 + 2];
                                              }
                                            }
                                            P_02.y = dStack_80;
                                            P_02.x = local_88;
                                            P_02.z = local_78;
                                            dVar25 = ON_PlaneEquation::ValueAt
                                                               ((ON_PlaneEquation *)&local_108,P_02)
                                            ;
                                            if (planar_tolerance < ABS(dVar25)) goto LAB_00528fcf;
                                          }
                                          uVar13 = (ulong)local_2f0 & 0xffffffff;
                                          uVar9 = local_310.m_count;
                                          if (__s[local_2dc] != 0xffffffff) goto LAB_005290c3;
                                          local_2d8 = (double)CONCAT44(local_2d8._4_4_,
                                                                       local_310.m_count);
                                          __s[local_2dc] = local_334;
                                          ON_SimpleArray<unsigned_int>::Append
                                                    (&local_310,&local_2dc);
                                          pNVar12 = ON_SimpleArray<NgonNeighbors>::AppendNew
                                                              (&local_2c0);
                                          plVar11 = (long *)((long)pNVar12 - lVar18);
                                          uVar13 = (ulong)local_2f0 & 0xffffffff;
                                          uVar9 = (uint)local_2d8;
                                          goto LAB_00529129;
                                        }
                                      }
                                    }
LAB_00528fcf:
                                    uVar13 = (ulong)local_2f0 & 0xffffffff;
                                    break;
                                  }
                                  lVar23 = lVar23 + 1;
                                  lVar18 = lVar18 + -8;
                                } while (lVar23 != 8);
                              }
                              goto LAB_00528fd3;
                            }
                            uVar14 = (ulong)uVar9;
                          }
                        }
                        goto LAB_00528c39;
                      }
                    }
                    puVar10 = (uint *)0x0;
                    uVar14 = (ulong)uVar9;
                  }
                  goto LAB_00528c39;
                }
                uVar14 = 0;
                uVar9 = 0;
LAB_0052922b:
                uVar15 = 0xffffffff;
                if (uVar9 < local_21c || (uint)uVar14 < local_2e4) {
                  uVar13 = local_2f8 & 0xffffffff;
LAB_005294c3:
                  if (local_290 != (ON_MeshNgon *)0x0) {
                    ON_SimpleArray<ON_MeshNgon_*>::Append(Ngons,&local_290);
                    local_334 = local_334 + 1;
                    local_2f8 = uVar13;
                    goto LAB_00529216;
                  }
                }
                else {
                  if (-1 < (long)local_2a8._16_8_) {
                    local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffff00000000;
                  }
                  uVar15 = (int)local_2f8 + 1;
                  uVar13 = (ulong)uVar15;
                  local_238 = uVar14;
                  uVar16 = GetNgonBoundarySegments
                                     (face_list,uVar9,local_310.m_a,uVar15,local_2c0.m_a,&local_2a8,
                                      (ON_SimpleArray<unsigned_int> *)0x0);
                  uVar15 = 0xffffffff;
                  if ((uVar16 == 0) || ((uint)local_2a8.m_count < local_2e4)) goto LAB_005294c3;
                  if ((uint)local_2a8.m_count < (uint)local_238) {
                    uVar15 = *local_2a8.m_a;
                    local_208 = -1.23432101234321e+308;
                    local_218 = _DAT_006a2b60;
                    if (uVar15 < vertex_list->m_point_count) {
                      pdVar17 = vertex_list->m_dP;
                      if (pdVar17 == (double *)0x0) {
                        uVar14 = (ulong)(uVar15 * vertex_list->m_point_stride);
                        uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar14);
                        local_218._0_8_ = (undefined8)(float)uVar1;
                        local_218._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
                        local_208 = (double)vertex_list->m_fP[uVar14 + 2];
                      }
                      else {
                        uVar14 = (ulong)(uVar15 * vertex_list->m_point_stride);
                        local_218 = *(undefined1 (*) [16])(pdVar17 + uVar14);
                        local_208 = pdVar17[uVar14 + 2];
                      }
                    }
                    ON_PlaneEquation::UnitNormal(&local_1d8,(ON_PlaneEquation *)local_128);
                    ON_Plane::ON_Plane(&local_108,(ON_3dPoint *)local_218,&local_1d8);
                    local_258 = (_func_int **)
                                Internal_NgonBoundaryArea(&local_108,vertex_list,&local_2a8);
                    uVar15 = (int)local_2f8 + 2;
                    while( true ) {
                      local_218._8_8_ = 0;
                      local_218._0_8_ = local_150;
                      local_208 = 0.0;
                      uVar13 = (ulong)uVar15;
                      uVar16 = GetNgonBoundarySegments
                                         (face_list,local_310.m_count,local_310.m_a,uVar15,
                                          local_2c0.m_a,(ON_SimpleArray<unsigned_int> *)local_218,
                                          (ON_SimpleArray<unsigned_int> *)0x0);
                      if ((uVar16 == 0) || (local_208._0_4_ < 3)) break;
                      pp_Var26 = (_func_int **)
                                 Internal_NgonBoundaryArea
                                           (&local_108,vertex_list,
                                            (ON_SimpleArray<unsigned_int> *)local_218);
                      if ((double)local_258 < (double)pp_Var26) {
                        local_258 = pp_Var26;
                        ON_SimpleArray<unsigned_int>::operator=
                                  (&local_2a8,(ON_SimpleArray<unsigned_int> *)local_218);
                      }
                      ON_SimpleArray<unsigned_int>::~ON_SimpleArray
                                ((ON_SimpleArray<unsigned_int> *)local_218);
                      uVar15 = uVar15 + 1;
                    }
                    ON_SimpleArray<unsigned_int>::~ON_SimpleArray
                              ((ON_SimpleArray<unsigned_int> *)local_218);
                    ON_Plane::~ON_Plane(&local_108);
                    if ((char)local_220 == '\0') {
                      uVar15 = 0xfffffffe;
                      local_1c0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                      goto LAB_005294c3;
                    }
                  }
                  local_290 = ON_MeshNgonAllocator::AllocateNgon
                                        (NgonAllocator,local_2a8.m_count,local_310.m_count);
                  if (local_290 != (ON_MeshNgon *)0x0) {
                    memcpy(local_290->m_vi,local_2a8.m_a,(ulong)local_290->m_Vcount << 2);
                    memcpy(local_290->m_fi,local_310.m_a,(ulong)local_290->m_Fcount << 2);
                    uVar15 = 0xffffffff;
                    goto LAB_005294c3;
                  }
                  uVar15 = 0xffffffff;
                }
                local_2f8 = uVar13;
                if ((local_310._16_8_ & 0xffffffff) != 0) {
                  uVar14 = 0;
                  do {
                    if (__s[(int)local_310.m_a[uVar14]] == local_334) {
                      __s[(int)local_310.m_a[uVar14]] = uVar15;
                    }
                    uVar14 = uVar14 + 1;
                  } while ((local_310._16_8_ & 0xffffffff) != uVar14);
                }
              }
            }
          }
        }
        else {
          local_1f8[0] = 0;
          local_1f8[1] = 0;
          local_1f8[2] = 0;
          local_1f8[3] = 0;
        }
      }
LAB_00529216:
      dVar20 = (double)((long)dVar20 + 1);
    } while (dVar20 != dVar25);
    if ((local_1c0 & 1) != 0) {
      dVar20 = 0.0;
      do {
        if (__s[(long)dVar20] == 0xfffffffe) {
          __s[(long)dVar20] = 0xffffffff;
        }
        dVar20 = (double)((long)dVar20 + 1);
      } while (dVar25 != dVar20);
    }
  }
  uVar15 = Ngons->m_count - local_2e0;
  ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_2c0);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_310);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_2a8);
  ON_MeshVertexFaceMap::~ON_MeshVertexFaceMap(&local_48);
  return uVar15;
  while (uVar14 = (ulong)uVar9, local_2dc != local_310.m_a[uVar14]) {
LAB_005290c3:
    uVar9 = uVar9 - 1;
    if (uVar9 <= local_268._0_4_) goto LAB_0052913d;
  }
  if (local_2c0.m_a[uVar14 - 1].m_NFS[lVar23] == 0) {
    plVar11 = (long *)((long)local_2c0.m_a + (uVar14 * 0x20 - lVar18));
LAB_00529129:
    *plVar11 = local_140;
    if (local_268._0_4_ < uVar9) {
      *(ulong *)((long)(local_2c0.m_a)->m_NFS + (long)local_258 * 8 + local_138) =
           lVar23 + (ulong)uVar9 * 8;
      puVar10 = local_278;
      uVar14 = local_238;
      face_list = local_2c8;
      dVar25 = local_240;
      vertex_face_map = local_248;
      goto LAB_00528c39;
    }
  }
LAB_0052913d:
  if (lVar23 == 9) goto LAB_00529147;
LAB_00528fd3:
  uVar9 = (int)uVar22 + 1;
  uVar22 = (ulong)uVar9;
  if (*puVar19 < uVar9) goto LAB_00529147;
  goto LAB_00528cba;
LAB_00529147:
  puVar10 = local_278;
  uVar14 = (ulong)local_288 & 0xffffffff;
  face_list = local_2c8;
  dVar25 = local_240;
  vertex_face_map = local_248;
LAB_00528c39:
  uVar13 = (ulong)uVar16;
  puVar19 = puVar10;
  pp_Var26 = pp_Var21;
  if (pp_Var21 == (_func_int **)0x4) goto LAB_005291d4;
  goto LAB_00528bef;
LAB_005291d4:
  uVar16 = SUB84(local_268,0) + 1;
  if (local_188._0_4_ <= uVar16) goto code_r0x005291fd;
  goto LAB_00528b37;
code_r0x005291fd:
  dVar20 = local_230;
  uVar9 = local_310.m_count;
  uVar16 = local_188._0_4_;
  if ((uint)local_310.m_count <= local_188._0_4_) goto LAB_0052922b;
  goto LAB_00528b2e;
}

Assistant:

unsigned int ON_MeshNgon::FindPlanarNgons(
  const ON_3dPointListRef& vertex_list,
  const ON_MeshFaceList& face_list,
  const unsigned int *const* vertex_face_map,
  double planar_tolerance,
  unsigned int minimum_ngon_vertex_count,
  unsigned int minimum_ngon_face_count,
  bool bAllowHoles,
  ON_MeshNgonAllocator& NgonAllocator,
  ON_SimpleArray<unsigned int>& NgonMap,
  ON_SimpleArray<ON_MeshNgon*>& Ngons
  )
{
  const unsigned int NgonsCount0 = Ngons.UnsignedCount();
  const unsigned int vertex_count = vertex_list.PointCount();
  const unsigned int face_count = face_list.FaceCount();
  unsigned int ngon_boundary_index = 0;
  const bool bQuadFaces = (4 == face_list.FaceVertexCount());

  ON_MeshVertexFaceMap ws_vfmap;

  ON_MeshNgon* ngon;
  unsigned int Fvi[4];
  unsigned int face_index, ngon_boundary_edge_count;
  ON_SimpleArray<unsigned int> ngon_vi;
  ON_SimpleArray<unsigned int> ngon_fi;
  ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
  ON_PlaneEquation e;

  bool bCleanUpNgonMap = false;

  for (;;)
  {
    if ( face_count <= 0 || face_count != NgonMap.UnsignedCount() )
      NgonMap.SetCount(0);

    if ( face_count <= 0 || vertex_count <= 0 )
      break;
   
    if ( 0 == vertex_face_map )
    {
      if ( !ws_vfmap.SetFromFaceList(vertex_count,face_list,false) )
        break;
      vertex_face_map = ws_vfmap.VertexFaceMap();
      if ( 0 == vertex_face_map )
        break;
    }

    ngon_vi.Reserve(128);
    ngon_fi.Reserve(128);
    ngon_nbr_map.Reserve(128);

    unsigned int* ngonMap = NgonMap.Array();
    if ( face_count != NgonMap.UnsignedCount() )
    {
      NgonMap.Reserve(face_count);
      NgonMap.SetCount(face_count);
      ngonMap = NgonMap.Array(); // in case a reallocation occurred.
      for ( face_index = 0; face_index < face_count; face_index++ )
        ngonMap[face_index] = ON_UNSET_UINT_INDEX;
    }

    int ngonIndex = NgonsCount0;
    unsigned int ngonUnsetIndex;
    const unsigned int omitted_face_mark = ON_UNSET_UINT_INDEX - 1;

    for ( face_index = 0; face_index < face_count; face_index++ )
    {
      if ( ON_UNSET_UINT_INDEX != ngonMap[face_index] )
        continue; // this face is not eligable for being in an n-gon

      face_list.QuadFvi(face_index,Fvi);
      if ( !GetFacePlaneEquation(vertex_list,bQuadFaces,Fvi,planar_tolerance,e) )
        continue; // degenerate face

      for (;;)
      {
        ngon = 0;
        ngonUnsetIndex = ON_UNSET_UINT_INDEX;

        // Note:
        //   ngon_boundary_count includes interior edges when the n-gon has holes
        ngon_boundary_edge_count = GetCoplanarConnectedFaces(
          vertex_list,
          face_list,
          ngonIndex, ngonMap, vertex_face_map,
          planar_tolerance, face_index, e, 
          ngon_fi,
          ngon_nbr_map
          );

        if ( ngon_boundary_edge_count < minimum_ngon_vertex_count )
          break;

        if ( ngon_fi.UnsignedCount() < minimum_ngon_face_count )
          break;

        ngon_boundary_index++;
        ngon_vi.SetCount(0);
        if ( !GetNgonBoundarySegments(face_list,
                            ngon_fi.UnsignedCount(),ngon_fi.Array(),
                            ngon_boundary_index,
                            ngon_nbr_map.Array(),
                            &ngon_vi,
                            0
                            ) 
           )
          break;

        if ( ngon_vi.UnsignedCount() < minimum_ngon_vertex_count )
          break;

        if ( ngon_vi.UnsignedCount() < ngon_boundary_edge_count )
        {
          // ngon has holes.
          // The boundary with the largest area is the outer boundary.
          const ON_Plane ngon_plane(vertex_list[ngon_vi[0]], e.UnitNormal());

          double ngon_vi_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi);

          for(;;)
          {
            ON_SimpleArray<unsigned int> ngon_vi1;
            ngon_boundary_index++;
            if ( !GetNgonBoundarySegments(face_list,
                                ngon_fi.UnsignedCount(),ngon_fi.Array(),
                                ngon_boundary_index,
                                ngon_nbr_map.Array(),
                                &ngon_vi1, 0) 
               )
              break;
            if ( ngon_vi1.UnsignedCount() < 3 )
              break;
            double ngon_vi1_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi1);
            if (ngon_vi1_area > ngon_vi_area)
            {
              ngon_vi_area = ngon_vi1_area;
              ngon_vi = ngon_vi1;
            }
          }

          if (false == bAllowHoles)
          {
            ngonUnsetIndex = omitted_face_mark;
            bCleanUpNgonMap = true;
            break;
          }
        }

        ngon = NgonAllocator.AllocateNgon(ngon_vi.UnsignedCount(),ngon_fi.UnsignedCount());
        if ( 0 == ngon )
          break;

        memcpy(ngon->m_vi,ngon_vi.Array(),ngon->m_Vcount*sizeof(ngon->m_vi[0]));
        memcpy(ngon->m_fi,ngon_fi.Array(),ngon->m_Fcount*sizeof(ngon->m_fi[0]));
        break; // finished new ngon
      }

      if (0 == ngon)
      {
        // undo any modifications that were made to ngonMap[]
        UnsetNgonMap(ngon_fi.Array(),ngon_fi.UnsignedCount(),ngonIndex,ngonUnsetIndex,ngonMap);
        continue;
      }

      // found a new ngon
      Ngons.Append(ngon);
      ngonIndex++;
    }
    if (bCleanUpNgonMap)
    {
      for (face_index = 0; face_index < face_count; face_index++)
      {
        if (omitted_face_mark == ngonMap[face_index])
          ngonMap[face_index] = ON_UNSET_UINT_INDEX;
      }
    }
    break;
  }



  return Ngons.UnsignedCount() - NgonsCount0;
}